

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O2

void __thiscall BVFixed::Or(BVFixed *this,BVFixed *bv)

{
  AssertBV(this,bv);
  for_each<void(BVUnitT<unsigned_long>::*)(BVUnitT<unsigned_long>)>(this,bv,0x60c120);
  return;
}

Assistant:

void
BVFixed::Or(const BVFixed*bv)
{
    AssertBV(bv);
    this->for_each(bv, &BVUnit::Or);
}